

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O1

int64_t google::protobuf::util::TimeUtil::TimestampToNanoseconds(Timestamp *timestamp)

{
  LogMessageFatal aLStack_18 [16];
  
  if (((timestamp->field_0)._impl_.seconds_ + 0xe7791f700U < 0x4977863880) &&
     ((uint)(timestamp->field_0)._impl_.nanos_ < 1000000000)) {
    return (long)(timestamp->field_0)._impl_.nanos_ +
           (timestamp->field_0)._impl_.seconds_ * 1000000000;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/util/time_util.cc"
             ,0x167,0x1b,"IsTimestampValid(timestamp)");
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (aLStack_18,0x27,"Timestamp is outside of the valid range");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
}

Assistant:

int64_t TimeUtil::TimestampToNanoseconds(const Timestamp& timestamp) {
  ABSL_DCHECK(IsTimestampValid(timestamp))
      << "Timestamp is outside of the valid range";
  return timestamp.seconds() * kNanosPerSecond + timestamp.nanos();
}